

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O0

void test_case_signed_sub(zt_unit_test *test,void *data)

{
  char cVar1;
  short sVar2;
  int iVar3;
  zt_unit_test *in_RDI;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  
  cVar1 = zt_char_sub('\x7f','\x01');
  if (cVar1 != '~') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_sub(CHAR_MAX, 1) == CHAR_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x9c);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_sub('\x01','\x7f');
  if (cVar1 != -0x7e) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_sub(1, CHAR_MAX) == 1 - CHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x9d);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_sub(-0x80,-1);
  if (cVar1 != -0x7f) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_sub(CHAR_MIN, -1) == CHAR_MIN - -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x9e);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_sub(-1,-0x80);
  if (cVar1 != '\x7f') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_sub(-1, CHAR_MIN) == -1 - CHAR_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x9f);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_sub('?','\x01');
  if (cVar1 != '>') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_char_sub(CHAR_MAX / 2, 1) == (CHAR_MAX / 2) - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xa0);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_sub('\x01','?');
  if (cVar1 != -0x3e) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_char_sub(1, CHAR_MAX / 2) == 1 - (CHAR_MAX / 2)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xa1);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_sub(0x7fff,1);
  if (sVar2 != 0x7ffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_sub(SHORT_MAX, 1) == SHORT_MAX - 1"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xa6);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_sub(1,0x7fff);
  if (sVar2 != -0x7ffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_sub(1, SHORT_MAX) == 1 - SHORT_MAX"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xa7);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_sub(-0x8000,-1);
  if (sVar2 != -0x7fff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_sub(SHORT_MIN, -1) == SHORT_MIN - -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xa8);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_sub(-1,-0x8000);
  if (sVar2 != 0x7fff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_sub(-1, SHORT_MIN) == -1 - SHORT_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xa9);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_sub(0x3fff,1);
  if (sVar2 != 0x3ffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_sub(SHORT_MAX / 2, 1) == (SHORT_MAX / 2) - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xaa);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_sub(1,0x3fff);
  if (sVar2 != -0x3ffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_sub(1, SHORT_MAX / 2) == 1 - (SHORT_MAX / 2)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xab);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_sub(0x7fffffff,1);
  if (iVar3 != 0x7ffffffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_sub(INT_MAX, 1) == INT_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xb0);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_sub(1,0x7fffffff);
  if (iVar3 != -0x7ffffffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_sub(1, INT_MAX) == 1 - INT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xb1);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_sub(-0x80000000,-1);
  if (iVar3 != -0x7fffffff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_sub(INT_MIN, -1) == INT_MIN - -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xb2);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_sub(-1,-0x80000000);
  if (iVar3 == 0x7fffffff) {
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_sub(0x3fffffff,1);
    if (iVar3 != 0x3ffffffe) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                             "zt_int_sub(INT_MAX / 2, 1) == (INT_MAX / 2) - 1",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0xb4);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_sub(1,0x3fffffff);
    if (iVar3 == -0x3ffffffe) {
      zt_unit_test_add_assertion(in_RDI);
      return;
    }
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_int_sub(1, INT_MAX / 2) == 1 - (INT_MAX / 2)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0xb5);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_sub(-1, INT_MIN) == -1 - INT_MIN",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                         ,0xb3);
  if (iVar3 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void
test_case_signed_sub(struct zt_unit_test *test, void *data UNUSED)
{
    /* subtraction overflow */

    ZT_UNIT_ASSERT(test, zt_char_sub(CHAR_MAX, 1) == CHAR_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_char_sub(1, CHAR_MAX) == 1 - CHAR_MAX);
    ZT_UNIT_ASSERT(test, zt_char_sub(CHAR_MIN, -1) == CHAR_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_char_sub(-1, CHAR_MIN) == -1 - CHAR_MIN);
    ZT_UNIT_ASSERT(test, zt_char_sub(CHAR_MAX / 2, 1) == (CHAR_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_char_sub(1, CHAR_MAX / 2) == 1 - (CHAR_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_sub(CHAR_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_sub(1, CHAR_MIN)); */

    ZT_UNIT_ASSERT(test, zt_short_sub(SHORT_MAX, 1) == SHORT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_short_sub(1, SHORT_MAX) == 1 - SHORT_MAX);
    ZT_UNIT_ASSERT(test, zt_short_sub(SHORT_MIN, -1) == SHORT_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_short_sub(-1, SHORT_MIN) == -1 - SHORT_MIN);
    ZT_UNIT_ASSERT(test, zt_short_sub(SHORT_MAX / 2, 1) == (SHORT_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_short_sub(1, SHORT_MAX / 2) == 1 - (SHORT_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_sub(SHORT_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_sub(1, SHORT_MIN)); */

    ZT_UNIT_ASSERT(test, zt_int_sub(INT_MAX, 1) == INT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_int_sub(1, INT_MAX) == 1 - INT_MAX);
    ZT_UNIT_ASSERT(test, zt_int_sub(INT_MIN, -1) == INT_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_int_sub(-1, INT_MIN) == -1 - INT_MIN);
    ZT_UNIT_ASSERT(test, zt_int_sub(INT_MAX / 2, 1) == (INT_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_int_sub(1, INT_MAX / 2) == 1 - (INT_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_sub(INT_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_sub(1, INT_MIN)); */

# ifndef __x86_64__
    ZT_UNIT_ASSERT(test, zt_long_sub(LONG_MAX, 1) == LONG_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_long_sub(1, LONG_MAX) == 1 - LONG_MAX);
    ZT_UNIT_ASSERT(test, zt_long_sub(LONG_MIN, -1) == LONG_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_long_sub(-1, LONG_MIN) == -1 - LONG_MIN);
    ZT_UNIT_ASSERT(test, zt_long_sub(LONG_MAX / 2, 1) == (LONG_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_long_sub(1, LONG_MAX / 2) == 1 - (LONG_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_sub(LONG_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_sub(1, LONG_MIN)); */
# endif /* ifndef __x86_64__ */
}